

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O1

void __thiscall BayesianGameBase::AddProbability(BayesianGameBase *this,Index i,double p)

{
  pointer pdVar1;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_20;
  
  if (this->_m_useSparse == true) {
    local_20.
    super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    .c_ = &this->_m_jTypeProbsSparse;
    local_20.i_ = (size_type)i;
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::get_d(&local_20);
    local_20.d_ = p + local_20.d_;
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::set(&local_20,&local_20.d_);
    return;
  }
  pdVar1 = (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1[i] = p + pdVar1[i];
  return;
}

Assistant:

void AddProbability(Index i, double p)
            {if(_m_useSparse) _m_jTypeProbsSparse[i]+=p;
                else _m_jTypeProbs[i]+=p;}